

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O2

void __thiscall Hes_Apu::reset(Hes_Apu *this)

{
  uchar *puVar1;
  undefined8 *puVar2;
  long lVar3;
  
  this->latch = 0;
  this->balance = 0xff;
  lVar3 = 0x2a0;
  do {
    puVar1 = this->oscs[0].wave + lVar3 + -0x40;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    puVar1 = this->oscs[0].wave + lVar3 + -0x50;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    puVar1 = this->oscs[0].wave + lVar3 + -0x60;
    puVar1[0] = '\0';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    puVar1[4] = '\0';
    puVar1[5] = '\0';
    puVar1[6] = '\0';
    puVar1[7] = '\0';
    puVar1[8] = '\0';
    puVar1[9] = '\0';
    puVar1[10] = '\0';
    puVar1[0xb] = '\0';
    puVar1[0xc] = '\0';
    puVar1[0xd] = '\0';
    puVar1[0xe] = '\0';
    puVar1[0xf] = '\0';
    puVar2 = (undefined8 *)((long)(this->oscs + -1) + lVar3);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar1 = this->oscs[0].wave + lVar3 + -8;
    puVar1[0] = '\x01';
    puVar1[1] = '\0';
    puVar1[2] = '\0';
    puVar1[3] = '\0';
    this->oscs[0].wave[lVar3 + -4] = '@';
    this->oscs[0].wave[lVar3 + -0x3a] = 0xff;
    lVar3 = lVar3 + -0x70;
  } while (lVar3 != 0);
  return;
}

Assistant:

void Hes_Apu::reset()
{
	latch   = 0;
	balance = 0xFF;
	
	Hes_Osc* osc = &oscs [osc_count];
	do
	{
		osc--;
		memset( osc, 0, offsetof (Hes_Osc,outputs) );
		osc->noise_lfsr = 1;
		osc->control    = 0x40;
		osc->balance    = 0xFF;
	}
	while ( osc != oscs );
}